

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

void __thiscall luna::Lexer::Lexer(Lexer *this,State *state,String *module,CharInStream *in)

{
  this->state_ = state;
  this->module_ = module;
  std::function<int_()>::function(&this->in_stream_,in);
  this->current_ = -1;
  this->line_ = 1;
  this->column_ = 0;
  (this->token_buffer_)._M_dataplus._M_p = (pointer)&(this->token_buffer_).field_2;
  (this->token_buffer_)._M_string_length = 0;
  (this->token_buffer_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Lexer::Lexer(State *state, String *module, CharInStream in)
        : state_(state),
          module_(module),
          in_stream_(in),
          current_(EOF),
          line_(1),
          column_(0)
    {
    }